

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O0

Sequence * __thiscall
Sequence::subsequence(Sequence *__return_storage_ptr__,Sequence *this,int begin,int end)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  int *piVar4;
  int local_28;
  int i;
  int end_local;
  int begin_local;
  Sequence *this_local;
  Sequence *seq;
  
  Sequence(__return_storage_ptr__,end - begin);
  for (local_28 = 0; iVar2 = size(__return_storage_ptr__), local_28 < iVar2; local_28 = local_28 + 1
      ) {
    pvVar3 = std::deque<int,_std::allocator<int>_>::operator[]
                       (&this->m_bits,(long)(begin + local_28));
    vVar1 = *pvVar3;
    piVar4 = operator[](__return_storage_ptr__,local_28);
    *piVar4 = vVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Sequence Sequence::subsequence(int begin, int end) {
    Sequence seq(end - begin);
    for (auto i = 0; i < seq.size(); ++i) {
        seq[i] = m_bits[begin + i];
    }
    return seq;
}